

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml_print.hpp
# Opt level: O0

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 rapidxml::internal::print_attributes<std::back_insert_iterator<std::__cxx11::string>,char>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,xml_node<char> *node,int flags)

{
  bool bVar1;
  char *pcVar2;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pbVar3;
  char *pcVar4;
  size_t sVar5;
  value_type local_79;
  xml_node<char> *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  value_type local_62 [2];
  xml_node<char> *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  value_type local_4a [2];
  xml_node<char> *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  value_type local_31;
  xml_attribute<char> *local_30;
  xml_attribute<char> *attribute;
  xml_node<char> *pxStack_20;
  int flags_local;
  xml_node<char> *node_local;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  out_local;
  
  attribute._4_4_ = flags;
  pxStack_20 = node;
  node_local = (xml_node<char> *)out.container;
  for (local_30 = xml_node<char>::first_attribute(node,(char *)0x0,0,true);
      local_30 != (xml_attribute<char> *)0x0;
      local_30 = xml_attribute<char>::next_attribute(local_30,(char *)0x0,0,true)) {
    pcVar2 = xml_base<char>::name(&local_30->super_xml_base<char>);
    if ((pcVar2 != (char *)0x0) &&
       (pcVar2 = xml_base<char>::value(&local_30->super_xml_base<char>), pcVar2 != (char *)0x0)) {
      local_31 = ' ';
      pbVar3 = std::
               back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&node_local);
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator=(pbVar3,&local_31);
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&node_local);
      pcVar2 = xml_base<char>::name(&local_30->super_xml_base<char>);
      pcVar4 = xml_base<char>::name(&local_30->super_xml_base<char>);
      sVar5 = xml_base<char>::name_size(&local_30->super_xml_base<char>);
      local_48 = node_local;
      local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 copy_chars<std::back_insert_iterator<std::__cxx11::string>,char>
                           (pcVar2,pcVar4 + sVar5,
                            (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )node_local);
      local_4a[1] = 0x3d;
      node_local = (xml_node<char> *)local_40;
      pbVar3 = std::
               back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&node_local);
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator=(pbVar3,local_4a + 1);
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&node_local);
      pcVar2 = xml_base<char>::value(&local_30->super_xml_base<char>);
      pcVar4 = xml_base<char>::value(&local_30->super_xml_base<char>);
      sVar5 = xml_base<char>::value_size(&local_30->super_xml_base<char>);
      bVar1 = find_char<char,____>(pcVar2,pcVar4 + sVar5);
      if (bVar1) {
        local_4a[0] = '\'';
        pbVar3 = std::
                 back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&node_local);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(pbVar3,local_4a);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&node_local);
        pcVar2 = xml_base<char>::value(&local_30->super_xml_base<char>);
        pcVar4 = xml_base<char>::value(&local_30->super_xml_base<char>);
        sVar5 = xml_base<char>::value_size(&local_30->super_xml_base<char>);
        local_60 = node_local;
        local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   copy_and_expand_chars<std::back_insert_iterator<std::__cxx11::string>,char>
                             (pcVar2,pcVar4 + sVar5,'\"',
                              (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )node_local);
        local_62[1] = 0x27;
        node_local = (xml_node<char> *)local_58;
        pbVar3 = std::
                 back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&node_local);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(pbVar3,local_62 + 1);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&node_local);
      }
      else {
        local_62[0] = '\"';
        pbVar3 = std::
                 back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&node_local);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(pbVar3,local_62);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&node_local);
        pcVar2 = xml_base<char>::value(&local_30->super_xml_base<char>);
        pcVar4 = xml_base<char>::value(&local_30->super_xml_base<char>);
        sVar5 = xml_base<char>::value_size(&local_30->super_xml_base<char>);
        local_78 = node_local;
        local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   copy_and_expand_chars<std::back_insert_iterator<std::__cxx11::string>,char>
                             (pcVar2,pcVar4 + sVar5,'\'',
                              (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )node_local);
        local_79 = '\"';
        node_local = (xml_node<char> *)local_70;
        pbVar3 = std::
                 back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&node_local);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(pbVar3,&local_79);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&node_local);
      }
    }
  }
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)node_local;
}

Assistant:

inline OutIt print_attributes(OutIt out, const xml_node<Ch> *node, int flags)
        {
            for (xml_attribute<Ch> *attribute = node->first_attribute(); attribute; attribute = attribute->next_attribute())
            {
                if (attribute->name() && attribute->value())
                {
                    // Print attribute name
                    *out = Ch(' '), ++out;
                    out = copy_chars(attribute->name(), attribute->name() + attribute->name_size(), out);
                    *out = Ch('='), ++out;
                    // Print attribute value using appropriate quote type
                    if (find_char<Ch, Ch('"')>(attribute->value(), attribute->value() + attribute->value_size()))
                    {
                        *out = Ch('\''), ++out;
                        out = copy_and_expand_chars(attribute->value(), attribute->value() + attribute->value_size(), Ch('"'), out);
                        *out = Ch('\''), ++out;
                    }
                    else
                    {
                        *out = Ch('"'), ++out;
                        out = copy_and_expand_chars(attribute->value(), attribute->value() + attribute->value_size(), Ch('\''), out);
                        *out = Ch('"'), ++out;
                    }
                }
            }
            return out;
        }